

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::begin_transform_feedback
               (NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  long lVar1;
  deUint32 buf;
  GLuint tfID [2];
  char *tfVarying;
  ProgramSources sources;
  ShaderProgram program;
  value_type local_210;
  GLuint local_1f0 [2];
  value_type local_1e8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [128];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_138;
  undefined1 local_118 [32];
  ShaderProgram local_f8;
  
  renderCtx = ctx->m_renderCtx;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,
             "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,"");
  local_118[0x10] = 0;
  local_118._17_8_ = 0;
  local_118._0_8_ = (pointer)0x0;
  local_118[8] = 0;
  local_118._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1c8,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1c8,&local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b8 + 8),&local_210);
  glu::ShaderProgram::ShaderProgram(&local_f8,renderCtx,(ProgramSources *)local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_118);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_138);
  lVar1 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1c8 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_210._M_dataplus._M_p._0_4_ = 0x1234;
  local_1e8._M_dataplus._M_p = "gl_Position";
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,(GLuint *)&local_210);
  glu::CallLogWrapper::glGenTransformFeedbacks(&ctx->super_CallLogWrapper,2,local_1f0);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_f8.m_program.m_program);
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (&ctx->super_CallLogWrapper,local_f8.m_program.m_program,1,(GLchar **)&local_1e8,0x8c8c)
  ;
  glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,local_f8.m_program.m_program);
  glu::CallLogWrapper::glBindTransformFeedback(&ctx->super_CallLogWrapper,0x8e22,local_1f0[0]);
  glu::CallLogWrapper::glBindBuffer
            (&ctx->super_CallLogWrapper,0x8c8e,(GLuint)local_210._M_dataplus._M_p);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x8c8e,0x20,(void *)0x0,0x88e8);
  glu::CallLogWrapper::glBindBufferBase
            (&ctx->super_CallLogWrapper,0x8c8e,0,(GLuint)local_210._M_dataplus._M_p);
  NegativeTestContext::expectError(ctx,0);
  local_1c8._0_8_ = (pointer)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "GL_INVALID_ENUM is generated if primitiveMode is not one of GL_POINTS, GL_LINES, or GL_TRIANGLES."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != (pointer)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
  }
  glu::CallLogWrapper::glBeginTransformFeedback(&ctx->super_CallLogWrapper,0xffffffff);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_1c8._0_8_ = (pointer)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "GL_INVALID_OPERATION is generated if transform feedback is already active.","");
  NegativeTestContext::beginSection(ctx,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != (pointer)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
  }
  glu::CallLogWrapper::glBeginTransformFeedback(&ctx->super_CallLogWrapper,4);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glBeginTransformFeedback(&ctx->super_CallLogWrapper,0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  local_1c8._0_8_ = (pointer)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "GL_INVALID_OPERATION is generated if any binding point used in transform feedback mode does not have a buffer object bound."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != (pointer)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
  }
  glu::CallLogWrapper::glBindBufferBase(&ctx->super_CallLogWrapper,0x8c8e,0,0);
  glu::CallLogWrapper::glBeginTransformFeedback(&ctx->super_CallLogWrapper,4);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glBindBufferBase
            (&ctx->super_CallLogWrapper,0x8c8e,0,(GLuint)local_210._M_dataplus._M_p);
  NegativeTestContext::endSection(ctx);
  local_1c8._0_8_ = (pointer)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "GL_INVALID_OPERATION is generated if no binding points would be used because no program object is active."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != (pointer)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
  }
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glBeginTransformFeedback(&ctx->super_CallLogWrapper,4);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,local_f8.m_program.m_program);
  NegativeTestContext::endSection(ctx);
  local_1c8._0_8_ = (pointer)local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "GL_INVALID_OPERATION is generated if no binding points would be used because the active program object has specified no varying variables to record."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != (pointer)local_1b8) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1b8._0_8_ + 1));
  }
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (&ctx->super_CallLogWrapper,local_f8.m_program.m_program,0,(GLchar **)0x0,0x8c8c);
  glu::CallLogWrapper::glBeginTransformFeedback(&ctx->super_CallLogWrapper,4);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glEndTransformFeedback(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,(GLuint *)&local_210);
  glu::CallLogWrapper::glDeleteTransformFeedbacks(&ctx->super_CallLogWrapper,2,local_1f0);
  NegativeTestContext::expectError(ctx,0);
  glu::ShaderProgram::~ShaderProgram(&local_f8);
  return;
}

Assistant:

void begin_transform_feedback (NegativeTestContext& ctx)
{
	GLuint						tfID[2];
	glu::ShaderProgram			program(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	deUint32					buf = 0x1234;
	const char* tfVarying		= "gl_Position";

	ctx.glGenBuffers				(1, &buf);
	ctx.glGenTransformFeedbacks		(2, tfID);

	ctx.glUseProgram				(program.getProgram());
	ctx.glTransformFeedbackVaryings	(program.getProgram(), 1, &tfVarying, GL_INTERLEAVED_ATTRIBS);
	ctx.glLinkProgram				(program.getProgram());
	ctx.glBindTransformFeedback		(GL_TRANSFORM_FEEDBACK, tfID[0]);
	ctx.glBindBuffer				(GL_TRANSFORM_FEEDBACK_BUFFER, buf);
	ctx.glBufferData				(GL_TRANSFORM_FEEDBACK_BUFFER, 32, DE_NULL, GL_DYNAMIC_DRAW);
	ctx.glBindBufferBase			(GL_TRANSFORM_FEEDBACK_BUFFER, 0, buf);
	ctx.expectError					(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if primitiveMode is not one of GL_POINTS, GL_LINES, or GL_TRIANGLES.");
	ctx.glBeginTransformFeedback	(-1);
	ctx.expectError					(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if transform feedback is already active.");
	ctx.glBeginTransformFeedback	(GL_TRIANGLES);
	ctx.expectError					(GL_NO_ERROR);
	ctx.glBeginTransformFeedback	(GL_POINTS);
	ctx.expectError					(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if any binding point used in transform feedback mode does not have a buffer object bound.");
	ctx.glBindBufferBase			(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0);
	ctx.glBeginTransformFeedback	(GL_TRIANGLES);
	ctx.expectError					(GL_INVALID_OPERATION);
	ctx.glBindBufferBase			(GL_TRANSFORM_FEEDBACK_BUFFER, 0, buf);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if no binding points would be used because no program object is active.");
	ctx.glUseProgram				(0);
	ctx.glBeginTransformFeedback	(GL_TRIANGLES);
	ctx.expectError					(GL_INVALID_OPERATION);
	ctx.glUseProgram				(program.getProgram());
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if no binding points would be used because the active program object has specified no varying variables to record.");
	ctx.glTransformFeedbackVaryings	(program.getProgram(), 0, 0, GL_INTERLEAVED_ATTRIBS);
	ctx.glBeginTransformFeedback	(GL_TRIANGLES);
	ctx.expectError					(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glEndTransformFeedback		();
	ctx.glDeleteBuffers				(1, &buf);
	ctx.glDeleteTransformFeedbacks	(2, tfID);
	ctx.expectError					(GL_NO_ERROR);
}